

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

float ****
gauden_param_read(char *file_name,int32 *out_n_mgau,int32 *out_n_feat,int32 *out_n_density,
                 int32 **out_veclen)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar5;
  uint32 local_a4;
  char **ppcStack_a0;
  uint32 chksum;
  char **argval;
  char **argname;
  float32 *buf;
  float32 ****out;
  int32 chksum_present;
  int32 byteswap;
  int32 *veclen;
  uint local_68;
  int32 n_density;
  int32 n_feat;
  int32 n_mgau;
  int32 blk;
  int32 n;
  int32 l;
  int32 k;
  int32 j;
  int32 i;
  FILE *fp;
  int32 **ppiStack_38;
  char tmp;
  int32 **out_veclen_local;
  int32 *out_n_density_local;
  int32 *out_n_feat_local;
  int32 *out_n_mgau_local;
  char *file_name_local;
  
  ppiStack_38 = out_veclen;
  out_veclen_local = (int32 **)out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_mgau;
  out_n_mgau_local = (int32 *)file_name;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,0x80,"Reading mixture gaussian parameter: %s\n",file_name);
  _j = fopen((char *)out_n_mgau_local,"rb");
  if (_j == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                   ,0x83,"Failed to open file \'%s\' for reading",out_n_mgau_local);
    file_name_local = (char *)0x0;
  }
  else {
    iVar1 = bio_readhdr((FILE *)_j,&argval,&stack0xffffffffffffff60,(int32 *)((long)&out + 4));
    if (iVar1 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
              ,0x89,"Failed to read header from file \'%s\'\n",out_n_mgau_local);
      fclose(_j);
      file_name_local = (char *)0x0;
    }
    else {
      out._0_4_ = 0;
      for (k = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
          argval[k] != (char *)0x0; k = k + 1) {
        iVar2 = strcmp(argval[k],"version");
        if (iVar2 == 0) {
          iVar2 = strcmp(ppcStack_a0[k],"1.0");
          if (iVar2 != 0) {
            in_stack_ffffffffffffff38 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0x94,"Version mismatch(%s): %s, expecting %s\n",out_n_mgau_local,ppcStack_a0[k]
                    ,"1.0");
          }
        }
        else {
          iVar2 = strcmp(argval[k],"chksum0");
          if (iVar2 == 0) {
            out._0_4_ = 1;
          }
        }
      }
      bio_hdrarg_free(argval,ppcStack_a0);
      ppcStack_a0 = (char **)0x0;
      argval = (char **)0x0;
      local_a4 = 0;
      iVar1 = bio_fread(&n_density,4,1,(FILE *)_j,out._4_4_,&local_a4);
      if (iVar1 == 1) {
        *out_n_feat_local = n_density;
        iVar1 = bio_fread(&local_68,4,1,(FILE *)_j,out._4_4_,&local_a4);
        if (iVar1 == 1) {
          *out_n_density_local = local_68;
          iVar1 = bio_fread((void *)((long)&veclen + 4),4,1,(FILE *)_j,out._4_4_,&local_a4);
          if (iVar1 != 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0xb1,"fread(%s) (#density/codebook) failed\n",out_n_mgau_local);
          }
          *(uint *)out_veclen_local = veclen._4_4_;
          _chksum_present =
               (int32 *)__ckd_calloc__((long)(int)local_68,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                       ,0xb6);
          *ppiStack_38 = _chksum_present;
          uVar3 = bio_fread(_chksum_present,4,local_68,(FILE *)_j,out._4_4_,&local_a4);
          if (uVar3 == local_68) {
            n_feat = 0;
            for (k = 0; k < (int)local_68; k = k + 1) {
              n_feat = _chksum_present[k] + n_feat;
            }
            iVar1 = bio_fread(&n_mgau,4,1,(FILE *)_j,out._4_4_,&local_a4);
            if (iVar1 == 1) {
              if (n_mgau == n_density * veclen._4_4_ * n_feat) {
                buf = (float32 *)
                      __ckd_calloc_3d__((long)n_density,(long)(int)local_68,(long)(int)veclen._4_4_,
                                        8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                        ,0xd4);
                argname = (char **)__ckd_calloc__((long)n_mgau,4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                                  ,0xd5);
                blk = 0;
                for (k = 0; k < n_density; k = k + 1) {
                  for (l = 0; l < (int)local_68; l = l + 1) {
                    for (n = 0; n < (int)veclen._4_4_; n = n + 1) {
                      *(void **)(*(long *)(*(long *)(buf + (long)k * 2) + (long)l * 8) + (long)n * 8
                                ) = (void *)((long)argname + (long)blk * 4);
                      blk = _chksum_present[l] + blk;
                    }
                  }
                }
                iVar1 = bio_fread(argname,4,n_mgau,(FILE *)_j,out._4_4_,&local_a4);
                if (iVar1 == n_mgau) {
                  if ((int)out != 0) {
                    bio_verify_chksum((FILE *)_j,out._4_4_,local_a4);
                  }
                  sVar4 = fread((void *)((long)&fp + 7),1,1,_j);
                  if (sVar4 == 1) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                            ,0xeb,"More data than expected in %s\n",out_n_mgau_local);
                    fclose(_j);
                    ckd_free_3d(buf);
                    file_name_local = (char *)0x0;
                  }
                  else {
                    fclose(_j);
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                            ,0xf3,"%d codebook, %d feature, size: \n",(ulong)(uint)n_density,
                            (ulong)local_68);
                    for (k = 0; k < (int)local_68; k = k + 1) {
                      err_msg(ERR_INFO,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                              ,0xf5," %dx%d\n",(ulong)veclen._4_4_,(ulong)(uint)_chksum_present[k]);
                    }
                    file_name_local = (char *)buf;
                  }
                }
                else {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                          ,0xe1,"Failed to read density data from file \'%s\'\n",out_n_mgau_local);
                  fclose(_j);
                  ckd_free_3d(buf);
                  file_name_local = (char *)0x0;
                }
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                        ,0xcd,
                        "Number of parameters in %s(%d) doesn\'t match dimensions: %d x %d x %d\n",
                        out_n_mgau_local,(ulong)(uint)n_mgau,CONCAT44(uVar5,n_density),veclen._4_4_,
                        n_feat);
                fclose(_j);
                file_name_local = (char *)0x0;
              }
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                      ,0xc5,"Failed to read number of parameters from %s\n",out_n_mgau_local);
              fclose(_j);
              file_name_local = (char *)0x0;
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0xba,"fread(%s) (feature-lengths) failed\n",out_n_mgau_local);
            fclose(_j);
            file_name_local = (char *)0x0;
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0xa9,"Failed to read number of features from %s\n",out_n_mgau_local);
          fclose(_j);
          file_name_local = (char *)0x0;
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                ,0xa1,"Failed to read number of codebooks from %s\n",out_n_mgau_local);
        fclose(_j);
        file_name_local = (char *)0x0;
      }
    }
  }
  return (float ****)file_name_local;
}

Assistant:

static float ****
gauden_param_read(const char *file_name,
                  int32 * out_n_mgau,
                  int32 * out_n_feat,
                  int32 * out_n_density,
                  int32 ** out_veclen)
{
    char tmp;
    FILE *fp;
    int32 i, j, k, l, n, blk;
    int32 n_mgau;
    int32 n_feat;
    int32 n_density;
    int32 *veclen;
    int32 byteswap, chksum_present;
    float32 ****out;
    float32 *buf;
    char **argname, **argval;
    uint32 chksum;

    E_INFO("Reading mixture gaussian parameter: %s\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file_name);
        return NULL;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read header from file '%s'\n", file_name);
        fclose(fp);
        return NULL;
    }

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], GAUDEN_PARAM_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], GAUDEN_PARAM_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* #Codebooks */
    if (bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of codebooks from %s\n", file_name);
        fclose(fp);
        return NULL;
    }
    *out_n_mgau = n_mgau;

    /* #Features/codebook */
    if (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of features from %s\n", file_name);
        fclose(fp);
        return NULL;
    }
    *out_n_feat = n_feat;

    /* #Gaussian densities/feature in each codebook */
    if (bio_fread(&n_density, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("fread(%s) (#density/codebook) failed\n", file_name);
    }
    *out_n_density = n_density;

    /* #Dimensions in each feature stream */
    veclen = ckd_calloc(n_feat, sizeof(uint32));
    *out_veclen = veclen;
    if (bio_fread(veclen, sizeof(int32), n_feat, fp, byteswap, &chksum) !=
        n_feat) {
        E_ERROR("fread(%s) (feature-lengths) failed\n", file_name);
        fclose(fp);
        return NULL;
    }

    /* blk = total vector length of all feature streams */
    for (i = 0, blk = 0; i < n_feat; i++)
        blk += veclen[i];

    /* #Floats to follow; for the ENTIRE SET of CODEBOOKS */
    if (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of parameters from %s\n", file_name);
        fclose(fp);
        return NULL;
    }

    if (n != n_mgau * n_density * blk) {
        E_ERROR
            ("Number of parameters in %s(%d) doesn't match dimensions: %d x %d x %d\n",
             file_name, n, n_mgau, n_density, blk);
        fclose(fp);
        return NULL;
    }

    /* Allocate memory for mixture gaussian densities if not already allocated */
    out = (float32 ****) ckd_calloc_3d(n_mgau, n_feat, n_density,
                                      sizeof(float32 *));
    buf = (float32 *) ckd_calloc(n, sizeof(float32));
    for (i = 0, l = 0; i < n_mgau; i++) {
        for (j = 0; j < n_feat; j++) {
            for (k = 0; k < n_density; k++) {
                out[i][j][k] = &buf[l];
                l += veclen[j];
            }
        }
    }

    /* Read mixture gaussian densities data */
    if (bio_fread(buf, sizeof(float32), n, fp, byteswap, &chksum) != n) {
        E_ERROR("Failed to read density data from file '%s'\n", file_name);
        fclose(fp);
        ckd_free_3d(out);
        return NULL;
    }

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&tmp, 1, 1, fp) == 1) {
        E_ERROR("More data than expected in %s\n", file_name);
        fclose(fp);
        ckd_free_3d(out);
        return NULL;
    }

    fclose(fp);

    E_INFO("%d codebook, %d feature, size: \n", n_mgau, n_feat);
    for (i = 0; i < n_feat; i++)
        E_INFO(" %dx%d\n", n_density, veclen[i]);

    return out;
}